

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000002ed250 = 0x2e2e2e2e2e2e2e;
    uRam00000000002ed257._0_1_ = '.';
    uRam00000000002ed257._1_1_ = '.';
    uRam00000000002ed257._2_1_ = '.';
    uRam00000000002ed257._3_1_ = '.';
    uRam00000000002ed257._4_1_ = '.';
    uRam00000000002ed257._5_1_ = '.';
    uRam00000000002ed257._6_1_ = '.';
    uRam00000000002ed257._7_1_ = '.';
    DAT_002ed240 = '.';
    DAT_002ed240_1._0_1_ = '.';
    DAT_002ed240_1._1_1_ = '.';
    DAT_002ed240_1._2_1_ = '.';
    DAT_002ed240_1._3_1_ = '.';
    DAT_002ed240_1._4_1_ = '.';
    DAT_002ed240_1._5_1_ = '.';
    DAT_002ed240_1._6_1_ = '.';
    uRam00000000002ed248 = 0x2e2e2e2e2e2e2e;
    DAT_002ed24f = 0x2e;
    DAT_002ed230 = '.';
    DAT_002ed230_1._0_1_ = '.';
    DAT_002ed230_1._1_1_ = '.';
    DAT_002ed230_1._2_1_ = '.';
    DAT_002ed230_1._3_1_ = '.';
    DAT_002ed230_1._4_1_ = '.';
    DAT_002ed230_1._5_1_ = '.';
    DAT_002ed230_1._6_1_ = '.';
    uRam00000000002ed238._0_1_ = '.';
    uRam00000000002ed238._1_1_ = '.';
    uRam00000000002ed238._2_1_ = '.';
    uRam00000000002ed238._3_1_ = '.';
    uRam00000000002ed238._4_1_ = '.';
    uRam00000000002ed238._5_1_ = '.';
    uRam00000000002ed238._6_1_ = '.';
    uRam00000000002ed238._7_1_ = '.';
    DAT_002ed220 = '.';
    DAT_002ed220_1._0_1_ = '.';
    DAT_002ed220_1._1_1_ = '.';
    DAT_002ed220_1._2_1_ = '.';
    DAT_002ed220_1._3_1_ = '.';
    DAT_002ed220_1._4_1_ = '.';
    DAT_002ed220_1._5_1_ = '.';
    DAT_002ed220_1._6_1_ = '.';
    uRam00000000002ed228._0_1_ = '.';
    uRam00000000002ed228._1_1_ = '.';
    uRam00000000002ed228._2_1_ = '.';
    uRam00000000002ed228._3_1_ = '.';
    uRam00000000002ed228._4_1_ = '.';
    uRam00000000002ed228._5_1_ = '.';
    uRam00000000002ed228._6_1_ = '.';
    uRam00000000002ed228._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000002ed218._0_1_ = '.';
    uRam00000000002ed218._1_1_ = '.';
    uRam00000000002ed218._2_1_ = '.';
    uRam00000000002ed218._3_1_ = '.';
    uRam00000000002ed218._4_1_ = '.';
    uRam00000000002ed218._5_1_ = '.';
    uRam00000000002ed218._6_1_ = '.';
    uRam00000000002ed218._7_1_ = '.';
    DAT_002ed25f = 0;
  }
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}